

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O0

void __thiscall
TPZFYsmpMatrix<std::complex<double>_>::MultiplyDummy
          (TPZFYsmpMatrix<std::complex<double>_> *this,TPZFYsmpMatrix<std::complex<double>_> *B,
          TPZFYsmpMatrix<std::complex<double>_> *Res)

{
  complex<double> *this_00;
  complex<double> *pcVar1;
  long *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  complex<double> aux;
  int64_t rows;
  int64_t k;
  int64_t j;
  int64_t i;
  complex<double> local_48;
  int64_t local_38;
  long local_30;
  long local_28;
  long local_20;
  long *local_18;
  TPZBaseMatrix *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  this_00 = (complex<double> *)TPZBaseMatrix::Rows(in_RSI);
  pcVar1 = (complex<double> *)TPZBaseMatrix::Rows(in_RDI);
  if (this_00 == pcVar1) {
    local_38 = TPZBaseMatrix::Rows(in_RDI);
    std::complex<double>::complex(&local_48,0.0,0.0);
    for (local_20 = 0; local_20 < local_38; local_20 = local_20 + 1) {
      for (local_28 = 0; local_28 < local_38; local_28 = local_28 + 1) {
        for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_20,local_30);
          (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_10,local_20,local_30);
          std::operator*((complex<double> *)in_RDI,(complex<double> *)0x148fb3e);
          std::complex<double>::operator+=(this_00,(complex<double> *)in_RDI);
        }
        (**(code **)(*local_18 + 0x118))(local_18,local_20,local_28,&local_48);
        std::complex<double>::operator=(&local_48,0.0);
      }
    }
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::MultiplyDummy(TPZFYsmpMatrix<TVar> & B, TPZFYsmpMatrix<TVar> & Res){
    int64_t i,j,k;
    if (B.Rows()!=this->Rows()) return;
    int64_t rows = this->Rows();
    TVar aux=0.;
    for(i=0;i<rows;i++){
        for(j=0;j<rows;j++){
            for(k=0;k<rows;k++){
				// C[i][j] += A[i][k]*B[k][j];
				aux+=GetVal(i,k)*B.GetVal(i,k);
			}
			Res.PutVal(i,j,aux);
			aux=0.;
		}
    }
}